

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

Export * kj::_::
         CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Export,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_true,_false>
         ::apply(Export *pos,Export *start,Export *end)

{
  Export *pEVar1;
  ExceptionGuard local_28;
  
  local_28.start = pos;
  local_28.pos = pos;
  if (start != end) {
    do {
      pEVar1 = local_28.pos;
      (local_28.pos)->canonical = start->canonical;
      (local_28.pos)->refcount = start->refcount;
      ((local_28.pos)->clientHook).disposer = (start->clientHook).disposer;
      ((local_28.pos)->clientHook).ptr = (start->clientHook).ptr;
      (start->clientHook).ptr = (ClientHook *)0x0;
      Maybe<kj::Promise<void>_>::Maybe(&(local_28.pos)->resolveOp,&start->resolveOp);
      (pEVar1->vineInfo).ptr.disposer = (start->vineInfo).ptr.disposer;
      (pEVar1->vineInfo).ptr.ptr = (start->vineInfo).ptr.ptr;
      (start->vineInfo).ptr.ptr = (VineInfo *)0x0;
      local_28.pos = local_28.pos + 1;
      start = start + 1;
    } while (start != end);
  }
  pEVar1 = local_28.pos;
  local_28.start = local_28.pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pEVar1;
}

Assistant:

inline explicit ExceptionGuard(T* pos): start(pos), pos(pos) {}